

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

void __thiscall
cmLinkLineComputer::ComputeLinkLibs
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  pointer pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  TargetType TVar3;
  ItemVector *pIVar4;
  OutputFormat format;
  pointer this_01;
  string_view source;
  uint7 uStack_f7;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e8;
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_98;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_88;
  string local_80;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  local_88 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
             linkLibraries;
  pIVar4 = cmComputeLinkInformation::GetItems(cli);
  this_01 = (pIVar4->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar4->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pIVar1) {
    do {
      if ((this_01->Target == (cmGeneratorTarget *)0x0) ||
         ((TVar3 = cmGeneratorTarget::GetType(this_01->Target), TVar3 != INTERFACE_LIBRARY &&
          (TVar3 = cmGeneratorTarget::GetType(this_01->Target), TVar3 != OBJECT_LIBRARY)))) {
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_98);
        local_e8.Value._M_dataplus._M_p = (pointer)&local_e8.Value.field_2;
        local_e8.Value.field_2._M_allocated_capacity = (ulong)uStack_f7 << 8;
        local_e8.Value._M_string_length = 0;
        local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_98.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             local_98.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_01->IsPath == Yes) {
          (*this->_vptr_cmLinkLineComputer[2])(&local_b8,this,this_01);
          format = (OutputFormat)this->UseNinjaMulti;
          if (this->ForResponse != false) {
            format = RESPONSE;
          }
          source._M_str = (char *)local_b8;
          source._M_len = local_b0;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_80,this->OutputConverter,source,format,this->UseWatcomQuote);
          cmComputeLinkInformation::Item::GetFormattedItem(&local_60,this_01,&local_80);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_60);
          _Var2._M_pi = local_60.Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          this_00._M_pi =
               local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Var2._M_pi;
          if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
             local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60.Value._M_dataplus._M_p != &local_60.Value.field_2) {
            operator_delete(local_60.Value._M_dataplus._M_p,
                            local_60.Value.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_e8);
          local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (this_01->Value).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     &(this_01->Value).Backtrace.
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::__cxx11::string::append((char *)&local_e8);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<BT<std::__cxx11::string>&>(local_88,&local_e8);
        if (local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.Value._M_dataplus._M_p != &local_e8.Value.field_2) {
          operator_delete(local_e8.Value._M_dataplus._M_p,
                          local_e8.Value.field_2._M_allocated_capacity + 1);
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pIVar1);
  }
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkLibs(
  cmComputeLinkInformation& cli, std::vector<BT<std::string>>& linkLibraries)
{
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  for (auto const& item : items) {
    if (item.Target &&
        (item.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
         item.Target->GetType() == cmStateEnums::OBJECT_LIBRARY)) {
      continue;
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      linkLib = item.GetFormattedItem(this->ConvertToOutputFormat(
        this->ConvertToLinkReference(item.Value.Value)));
    } else {
      linkLib = item.Value;
    }
    linkLib.Value += " ";

    linkLibraries.emplace_back(linkLib);
  }
}